

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyToBuffer::verify
          (BufferCopyToBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ResultCollector *this_00;
  long lVar1;
  DeviceInterface *vkd;
  VkDevice device;
  VkQueue queue;
  VkResult result;
  int iVar2;
  int extraout_EAX;
  void *pvVar3;
  undefined4 extraout_var;
  Hex<8UL> *value;
  Hex<8UL> *value_00;
  ulong uVar4;
  ulong local_228;
  uchar *local_220;
  RefBase<vk::VkCommandBuffer_s_*> local_218;
  string local_1f8;
  ulong local_1d8;
  string local_1d0;
  ulong local_1b0;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  RefBase<vk::VkCommandBuffer_s_*> local_68;
  deUint64 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  this_00 = *(ResultCollector **)(ctx + 8);
  lVar1 = *(long *)(ctx + 0x10);
  vkd = *(DeviceInterface **)(lVar1 + 8);
  device = *(VkDevice *)(lVar1 + 0x18);
  queue = *(VkQueue *)(lVar1 + 0x20);
  local_220 = sig;
  createBeginCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_68,vkd,device,
             (VkCommandPool)*(deUint64 *)(lVar1 + 0x48),(VkCommandBufferLevel)tbs);
  local_218.m_data.deleter.m_device = local_68.m_data.deleter.m_device;
  local_218.m_data.deleter.m_pool.m_internal = local_68.m_data.deleter.m_pool.m_internal;
  local_218.m_data.object = local_68.m_data.object;
  local_218.m_data.deleter.m_deviceIface = local_68.m_data.deleter.m_deviceIface;
  local_68.m_data.object = (VkCommandBuffer_s *)0x0;
  local_68.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_68.m_data.deleter.m_device = (VkDevice)0x0;
  local_68.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_68);
  local_68.m_data.object = (VkCommandBuffer_s *)CONCAT44(local_68.m_data.object._4_4_,0x2c);
  local_68.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_68.m_data.deleter.m_device = (VkDevice)0x200000001000;
  local_68.m_data.deleter.m_pool.m_internal = 0xffffffffffffffff;
  local_48 = (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
  local_40 = 0;
  local_38 = 0xffffffffffffffff;
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,local_218.m_data.object,0x1000,0x4000,0,0,0,1,&local_68,0,0);
  result = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,local_218.m_data.object);
  ::vk::checkResult(result,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x92f);
  queueRun(vkd,queue,local_218.m_data.object);
  pvVar3 = mapMemory(vkd,device,
                     (VkDeviceMemory)
                     (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                     m_internal,this->m_bufferSize);
  ::vk::invalidateMappedMemoryRange
            (vkd,device,
             (VkDeviceMemory)
             (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
             ,0,this->m_bufferSize);
  uVar4 = 0;
  do {
    local_228 = uVar4;
    if (this->m_bufferSize == uVar4) {
LAB_00651c29:
      (*vkd->_vptr_DeviceInterface[8])
                (vkd,device,
                 (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                 m_internal);
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_218);
      return extraout_EAX;
    }
    if (((*(ulong *)(*(long *)(ctx + 0x30) + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0) &&
       (*(char *)((long)pvVar3 + uVar4) != *(char *)(*(long *)(ctx + 0x18) + uVar4))) {
      de::toString<unsigned_long>(&local_188,(unsigned_long *)&local_220);
      std::operator+(&local_168,&local_188,":");
      iVar2 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
      std::operator+(&local_148,&local_168,(char *)CONCAT44(extraout_var,iVar2));
      std::operator+(&local_128,&local_148," Result differs from reference, Expected: ");
      local_1b0 = (ulong)*(byte *)(*(long *)(ctx + 0x18) + uVar4);
      de::toString<tcu::Format::Hex<8ul>>(&local_1a8,(de *)&local_1b0,value);
      std::operator+(&local_108,&local_128,&local_1a8);
      std::operator+(&local_e8,&local_108,", Got: ");
      local_1d8 = (ulong)*(byte *)((long)pvVar3 + uVar4);
      de::toString<tcu::Format::Hex<8ul>>(&local_1d0,(de *)&local_1d8,value_00);
      std::operator+(&local_c8,&local_e8,&local_1d0);
      std::operator+(&local_a8,&local_c8,", At offset: ");
      de::toString<unsigned_long>(&local_1f8,&local_228);
      std::operator+(&local_88,&local_a8,&local_1f8);
      tcu::ResultCollector::fail(this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      goto LAB_00651c29;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void BufferCopyToBuffer::verify (VerifyContext& context, size_t commandIndex)
{
	tcu::ResultCollector&					resultCollector	(context.getResultCollector());
	ReferenceMemory&						reference		(context.getReference());
	const vk::DeviceInterface&				vkd				= context.getContext().getDeviceInterface();
	const vk::VkDevice						device			= context.getContext().getDevice();
	const vk::VkQueue						queue			= context.getContext().getQueue();
	const vk::VkCommandPool					commandPool		= context.getContext().getCommandPool();
	const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vk::VkBufferMemoryBarrier			barrier			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
		DE_NULL,

		vk::VK_ACCESS_TRANSFER_WRITE_BIT,
		vk::VK_ACCESS_HOST_READ_BIT,

		VK_QUEUE_FAMILY_IGNORED,
		VK_QUEUE_FAMILY_IGNORED,
		*m_dstBuffer,
		0,
		VK_WHOLE_SIZE
	};

	vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &barrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
	queueRun(vkd, queue, *commandBuffer);

	{
		void* const	ptr		= mapMemory(vkd, device, *m_memory, m_bufferSize);
		bool		isOk	= true;

		vk::invalidateMappedMemoryRange(vkd, device, *m_memory, 0, m_bufferSize);

		{
			const deUint8* const data = (const deUint8*)ptr;

			for (size_t pos = 0; pos < (size_t)m_bufferSize; pos++)
			{
				if (reference.isDefined(pos))
				{
					if (data[pos] != reference.get(pos))
					{
						resultCollector.fail(
								de::toString(commandIndex) + ":" + getName()
								+ " Result differs from reference, Expected: "
								+ de::toString(tcu::toHex<8>(reference.get(pos)))
								+ ", Got: "
								+ de::toString(tcu::toHex<8>(data[pos]))
								+ ", At offset: "
								+ de::toString(pos));
						break;
					}
				}
			}
		}

		vkd.unmapMemory(device, *m_memory);

		if (!isOk)
			context.getLog() << TestLog::Message << commandIndex << ": Buffer copy to buffer verification failed" << TestLog::EndMessage;
	}
}